

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
__thiscall anon_unknown.dwarf_643cf::SymlinkTool::createCommand(SymlinkTool *this,StringRef name)

{
  Command *this_00;
  size_t in_RCX;
  StringRef name_00;
  
  this_00 = (Command *)operator_new(0xc0);
  name_00.Length = in_RCX;
  name_00.Data = (char *)name.Length;
  llbuild::buildsystem::Command::Command(this_00,name_00);
  (this_00->super_JobDescriptor)._vptr_JobDescriptor = (_func_int **)&PTR__SymlinkCommand_001da510;
  this_00[1].super_JobDescriptor._vptr_JobDescriptor =
       (_func_int **)&this_00[1].name._M_string_length;
  this_00[1].name._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&this_00[1].name._M_string_length = 0;
  *(pointer **)((long)&this_00[1].name.field_2 + 8) =
       &this_00[1].inputs.
        super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  this_00[1].inputs.
  super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined1 *)
   &this_00[1].inputs.
    super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = 0;
  this_00[1].outputs.
  super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&this_00[1].outputs.
                 super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this_00[1].outputs.
  super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   &this_00[1].outputs.
    super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  this_00->repairViaOwnershipAnalysis = (bool)name.Data[0x28];
  (this->super_Tool)._vptr_Tool = (_func_int **)this_00;
  return (__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Command> createCommand(StringRef name) override {
    auto res = llvm::make_unique<SymlinkCommand>(name);
    res->repairViaOwnershipAnalysis = repairViaOwnershipAnalysis;
    return res;
  }